

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O1

void mark_chests(dw_rom *rom,uint8_t flag)

{
  uint8_t *puVar1;
  dw_chest *pdVar2;
  dungeon_map *pdVar3;
  long lVar4;
  dungeon_map *pdVar5;
  uint8_t uVar6;
  
  pdVar3 = maps;
  lVar4 = 0;
  do {
    pdVar2 = rom->chests;
    uVar6 = pdVar3->index;
    if (uVar6 != '\0') {
      pdVar5 = pdVar3;
      do {
        if (uVar6 == pdVar2[lVar4].map) goto LAB_0016954e;
        uVar6 = pdVar5[1].index;
        pdVar5 = pdVar5 + 1;
      } while (uVar6 != '\0');
    }
    pdVar5 = (dungeon_map *)0x0;
LAB_0016954e:
    if ((((pdVar5 != (dungeon_map *)0x0) &&
         (*(char *)((long)pdVar5 +
                   (ulong)pdVar2[lVar4].y + 3 +
                   (ulong)pdVar2[lVar4].x * 0x20 + (ulong)pdVar2[lVar4].x * -2) == '\f')) &&
        (rom->chest_access[lVar4] = rom->chest_access[lVar4] | flag, (flag & 0xf) != 0)) &&
       (pdVar2[lVar4].item == '\x03')) {
      puVar1 = &(rom->map).key_access;
      *puVar1 = *puVar1 | flag;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x1f) {
      return;
    }
  } while( true );
}

Assistant:

static void mark_chests(dw_rom *rom, uint8_t flag)
{
    size_t i, x, y;
    dw_chest *chest;
    dungeon_map *map;

    for (i = 0; i < CHEST_COUNT; i++) {
        chest = &rom->chests[i];
        map = get_map(chest->map);
        if (!map)
            continue;
        x = chest->x;
        y = chest->y;
        if (map->tiles[x][y] == (DUNGEON_TILE_CHEST | 8)) {
            rom->chest_access[i] |= flag;
            if (flag & 0xf && chest->item == KEY)
                rom->map.key_access |= flag;
        }
    }
}